

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  buffer<unsigned_int> *pbVar3;
  pointer p;
  ulong in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  uint *in_stack_ffffffffffffff98;
  allocator_type *in_stack_ffffffffffffffa0;
  buffer<unsigned_int> *this_00;
  buffer<unsigned_int> *__last;
  uint *__first;
  size_type local_48;
  size_type local_28;
  
  local_48 = std::allocator_traits<std::allocator<unsigned_int>_>::max_size
                       ((allocator_type *)0x1cf7b4);
  sVar1 = detail::buffer<unsigned_int>::capacity(in_RDI);
  uVar2 = sVar1 + (sVar1 >> 1);
  local_28 = in_RSI;
  if ((in_RSI <= uVar2) && (local_28 = uVar2, local_48 < uVar2)) {
    if (local_48 < in_RSI) {
      local_48 = in_RSI;
    }
    local_28 = local_48;
  }
  pbVar3 = (buffer<unsigned_int> *)detail::buffer<unsigned_int>::data(in_RDI);
  p = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  this_00 = pbVar3;
  __last = pbVar3;
  sVar1 = detail::buffer<unsigned_int>::size(in_RDI);
  __first = (uint *)((long)&this_00->_vptr_buffer + sVar1 * 4);
  detail::make_checked<unsigned_int>(p,local_28);
  std::uninitialized_copy<unsigned_int*,unsigned_int*>(__first,(uint *)__last,(uint *)this_00);
  detail::buffer<unsigned_int>::set(in_RDI,p,local_28);
  if (pbVar3 != in_RDI + 1) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)this_00,in_stack_ffffffffffffff98,0x1cf8ee);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(
    size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}